

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GetTargetCompileFlags
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *config,string *lang,
          string *flags)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string local_a8;
  string local_88;
  string local_58 [32];
  cmMakefile *local_38;
  cmMakefile *mf;
  string *flags_local;
  string *lang_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  
  mf = (cmMakefile *)flags;
  flags_local = lang;
  lang_local = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  local_38 = GetMakefile(this);
  AddLanguageFlags(this,(string *)mf,(cmGeneratorTarget *)config_local,flags_local,lang_local);
  AddArchitectureFlags(this,(string *)mf,(cmGeneratorTarget *)config_local,flags_local,lang_local);
  bVar2 = std::operator==(flags_local,"Fortran");
  pcVar1 = mf;
  if (bVar2) {
    (*this->_vptr_cmLocalGenerator[0xd])(local_58,this,config_local,lang_local);
    (*this->_vptr_cmLocalGenerator[6])(this,pcVar1,local_58);
    std::__cxx11::string::~string(local_58);
  }
  AddCMP0018Flags(this,(string *)mf,(cmGeneratorTarget *)config_local,flags_local,lang_local);
  AddVisibilityPresetFlags(this,(string *)mf,(cmGeneratorTarget *)config_local,flags_local);
  pcVar1 = mf;
  cmMakefile::GetDefineFlags_abi_cxx11_(&local_88,local_38);
  (*this->_vptr_cmLocalGenerator[6])(this,pcVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  pcVar1 = mf;
  GetFrameworkFlags(&local_a8,this,flags_local,lang_local,(cmGeneratorTarget *)config_local);
  (*this->_vptr_cmLocalGenerator[6])(this,pcVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  AddCompileOptions(this,(string *)mf,(cmGeneratorTarget *)config_local,flags_local,lang_local);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetCompileFlags(cmGeneratorTarget* target,
                                             std::string const& config,
                                             std::string const& lang,
                                             std::string& flags)
{
  cmMakefile* mf = this->GetMakefile();

  // Add language-specific flags.
  this->AddLanguageFlags(flags, target, lang, config);

  this->AddArchitectureFlags(flags, target, lang, config);

  if (lang == "Fortran") {
    this->AppendFlags(flags, this->GetTargetFortranFlags(target, config));
  }

  this->AddCMP0018Flags(flags, target, lang, config);
  this->AddVisibilityPresetFlags(flags, target, lang);
  this->AppendFlags(flags, mf->GetDefineFlags());
  this->AppendFlags(flags, this->GetFrameworkFlags(lang, config, target));
  this->AddCompileOptions(flags, target, lang, config);
}